

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

int __thiscall DetectorSS::Estimate(DetectorSS *this,int bucket,uchar *bmp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined8 in_XMM2_Qb;
  int local_4c;
  ulong local_48;
  undefined1 extraout_var [56];
  
  iVar6 = (this->ss_).c;
  iVar5 = bucket * (this->ss_).offsets[iVar6];
  if ((long)iVar6 < 2) {
    uVar8 = 0;
    iVar7 = 1;
  }
  else {
    iVar4 = (this->ss_).b;
    iVar7 = 1;
    uVar8 = 0;
    do {
      iVar6 = (this->ss_).offsets[uVar8] + iVar5;
      iVar3 = countzerobits(bmp,iVar6,iVar4 + iVar6);
      iVar4 = (this->ss_).b;
      iVar6 = (this->ss_).c;
      if (iVar4 - iVar3 <= (this->ss_).setmax) break;
      iVar7 = iVar7 * 2;
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)iVar6 + -1);
  }
  local_4c = (int)uVar8 + -1;
  iVar6 = iVar6 + -1;
  if ((int)uVar8 < iVar6) {
    uVar9 = uVar8 & 0xffffffff;
    local_48 = 0;
    do {
      iVar6 = (this->ss_).offsets[uVar9] + iVar5;
      iVar6 = countzerobits(bmp,iVar6,(this->ss_).b + iVar6);
      dVar10 = (double)(this->ss_).b;
      dVar11 = log(dVar10);
      dVar12 = log((double)iVar6);
      if ((iVar6 == 0) || ((this->ss_).setmax < (this->ss_).b - iVar6)) {
        local_48 = 0;
        local_4c = (int)uVar9;
      }
      else {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_48;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar10;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar11 - dVar12;
        auVar2 = vfmadd231sd_fma(auVar18,auVar13,auVar2);
        local_48 = auVar2._0_8_;
      }
      uVar9 = uVar9 + 1;
      iVar6 = (this->ss_).c + -1;
    } while ((int)uVar9 < iVar6);
  }
  else {
    local_48 = 0;
  }
  iVar5 = iVar5 + (this->ss_).offsets[iVar6];
  iVar6 = countzerobits(bmp,iVar5,(this->ss_).lastb + iVar5);
  auVar15._0_8_ = (double)(this->ss_).lastb;
  auVar17._0_8_ = log(auVar15._0_8_);
  auVar17._8_56_ = extraout_var;
  auVar14 = auVar17._0_16_;
  if (iVar6 != 0) {
    dVar10 = log((double)iVar6);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar17._0_8_ - dVar10;
  }
  auVar15._8_8_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_48;
  auVar2 = vfmadd213sd_fma(auVar14,auVar15,auVar1);
  auVar16._0_8_ = (double)(iVar7 << ((byte)(((char)local_4c - (char)uVar8) + 1) & 0x1f));
  auVar16._8_8_ = in_XMM2_Qb;
  auVar2 = vfmadd213sd_fma(auVar16,auVar2,ZEXT816(0x3fe0000000000000));
  return (int)auVar2._0_8_;
}

Assistant:

int DetectorSS::Estimate(int bucket, unsigned char* bmp) {
	int offs = bucket * ss_.offsets[ss_.c];
	int z, tmpoff = 0, base;
	double m;
	int factor = 1;
	for (base = 0; base < ss_.c - 1; base++) {
		tmpoff = offs + ss_.offsets[base];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		//TL: if the bitmap is not full
		if (ss_.b - z <= ss_.setmax) {
			break;
		}
		else {
			factor = factor * 2;
		}
	}
	m = 0;

	int pos = base - 1;
	for (int i = base; i < ss_.c - 1; i++) {
		tmpoff = offs + ss_.offsets[i];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		m += ss_.b * (log(ss_.b) - log(z));
		if (z == 0 || ss_.b - z > ss_.setmax) {
			pos = i;
			m = 0;
		}
	}
	factor = factor * (1 << (pos - base + 1));

	tmpoff = offs + ss_.offsets[ss_.c - 1];
	z = countzerobits(bmp, tmpoff, tmpoff + ss_.lastb);
	if (z == 0) {
		m += ss_.lastb * (log(ss_.lastb));
	}
	else {
		m += ss_.lastb * (log(ss_.lastb) - log(z));
	}
	return (int)(factor * m + 0.5);
}